

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

int __thiscall NNTreeImpl::remove(NNTreeImpl *this,char *__filename)

{
  pointer pTVar1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  iterator iter;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  iterator local_80;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)__filename);
  find(&local_80,this,(QPDFObjectHandle *)&local_90,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  if (-1 < local_80.item_number) {
    if (in_RDX != (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pTVar1 = NNTreeIterator::operator->(&local_80);
      this = (NNTreeImpl *)&pTVar1->second;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                (in_RDX,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this);
    }
    NNTreeIterator::remove(&local_80,(char *)this);
  }
  NNTreeIterator::~NNTreeIterator(&local_80);
  return (int)CONCAT71((int7)((ulong)in_RDX >> 8),-1 < local_80.item_number);
}

Assistant:

bool
NNTreeImpl::remove(QPDFObjectHandle key, QPDFObjectHandle* value)
{
    auto iter = find(key, false);
    if (!iter.valid()) {
        QTC::TC("qpdf", "NNTree remove not found");
        return false;
    }
    if (value) {
        *value = iter->second;
    }
    iter.remove();
    return true;
}